

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

bool __thiscall Router::Reachable(Router *this,Vec2 pos)

{
  uint uVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  pointer pvVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = pos.x;
  fVar9 = pos.y;
  bVar3 = false;
  bVar4 = false;
  if ((((0.0 <= fVar8) && (bVar4 = bVar3, fVar8 <= 60.0)) && (0.0 <= fVar9)) && (fVar9 <= 90.0)) {
    uVar1 = this->ObstacleCount;
    pvVar6 = (this->Obstacles).
             super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pfVar2 = *(float **)
                &(pvVar6->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                 super__Vector_impl_data;
      if (((*pfVar2 + -0.05 + -0.0001 < fVar8) && (fVar8 < pfVar2[4] + 0.05 + 0.0001)) &&
         ((pfVar2[1] + -0.05 + -0.0001 < fVar9 && (fVar9 < pfVar2[5] + 0.05 + 0.0001)))) {
        return false;
      }
      pvVar6 = pvVar6 + 1;
    }
    bVar4 = (long)(int)uVar1 <= (long)uVar5;
  }
  return bVar4;
}

Assistant:

bool Router::Reachable(Vec2 pos)
{
    if (pos.x < 0 || pos.x > MapWidth || pos.y < 0 || pos.y > MapHeight)
        return false;
    for (int i = 0; i < ObstacleCount; ++i)
        if (pos.x > Obstacles[i][0].x - ObsBorder - EPS
            && pos.x < Obstacles[i][2].x + ObsBorder + EPS
            && pos.y > Obstacles[i][0].y - ObsBorder - EPS
            && pos.y < Obstacles[i][2].y + ObsBorder + EPS)
            return false;
    return true;
}